

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_method_curve25519_key_exchange(LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  uchar *local_30;
  uchar *s;
  int rc;
  int ret;
  key_exchange_state_low_t *key_state_local;
  LIBSSH2_SESSION *session_local;
  
  s._4_4_ = 0;
  s._0_4_ = 0;
  if (key_state->state == libssh2_NB_state_idle) {
    key_state->public_key_oct = (uchar *)0x0;
    key_state->state = libssh2_NB_state_created;
  }
  _rc = key_state;
  key_state_local = (key_exchange_state_low_t *)session;
  if (key_state->state == libssh2_NB_state_created) {
    local_30 = (uchar *)0x0;
    s._0_4_ = strcmp(session->kex->name,"curve25519-sha256@libssh.org");
    if ((int)s != 0) {
      s._0_4_ = strcmp(*(char **)(key_state_local->exchange_state).tmp_len,"curve25519-sha256");
    }
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,-1,
                               "Unknown KEX curve25519 curve type");
      goto LAB_0011448e;
    }
    s._0_4_ = _libssh2_curve25519_new
                        ((LIBSSH2_SESSION *)key_state_local,&_rc->curve25519_public_key,
                         &_rc->curve25519_private_key);
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,
                               "Unable to create private key");
      goto LAB_0011448e;
    }
    _rc->request[0] = '\x1e';
    local_30 = _rc->request + 1;
    _libssh2_store_str(&local_30,(char *)_rc->curve25519_public_key,0x20);
    _rc->request_len = 0x25;
    _rc->state = libssh2_NB_state_sent;
  }
  if (_rc->state == libssh2_NB_state_sent) {
    s._0_4_ = _libssh2_transport_send
                        ((LIBSSH2_SESSION *)key_state_local,_rc->request,_rc->request_len,
                         (uchar *)0x0,0);
    if ((int)s == -0x25) {
      return -0x25;
    }
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,"Unable to send ECDH_INIT")
      ;
      goto LAB_0011448e;
    }
    _rc->state = libssh2_NB_state_sent1;
  }
  if (_rc->state == libssh2_NB_state_sent1) {
    s._0_4_ = _libssh2_packet_require
                        ((LIBSSH2_SESSION *)key_state_local,'\x1f',&_rc->data,&_rc->data_len,0,
                         (uchar *)0x0,0,&_rc->req_state);
    if ((int)s == -0x25) {
      return -0x25;
    }
    if ((int)s != 0) {
      s._4_4_ = _libssh2_error((LIBSSH2_SESSION *)key_state_local,(int)s,
                               "Timeout waiting for ECDH_REPLY reply");
      goto LAB_0011448e;
    }
    _rc->state = libssh2_NB_state_sent2;
  }
  if ((_rc->state == libssh2_NB_state_sent2) &&
     (s._4_4_ = curve25519_sha256((LIBSSH2_SESSION *)key_state_local,_rc->data,_rc->data_len,
                                  _rc->curve25519_public_key,_rc->curve25519_private_key,
                                  &_rc->exchange_state), s._4_4_ == -0x25)) {
    return -0x25;
  }
LAB_0011448e:
  kex_method_curve25519_cleanup((LIBSSH2_SESSION *)key_state_local,_rc);
  return s._4_4_;
}

Assistant:

static int
kex_method_curve25519_key_exchange
(LIBSSH2_SESSION * session, key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc = 0;

    if(key_state->state == libssh2_NB_state_idle) {

        key_state->public_key_oct = NULL;
        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        unsigned char *s = NULL;

        rc = strcmp(session->kex->name, "curve25519-sha256@libssh.org");
        if(rc)
            rc = strcmp(session->kex->name, "curve25519-sha256");

        if(rc) {
            ret = _libssh2_error(session, -1,
                                 "Unknown KEX curve25519 curve type");
            goto clean_exit;
        }

        rc = _libssh2_curve25519_new(session,
                                     &key_state->curve25519_public_key,
                                     &key_state->curve25519_private_key);

        if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to create private key");
            goto clean_exit;
        }

        key_state->request[0] = SSH2_MSG_KEX_ECDH_INIT;
        s = key_state->request + 1;
        _libssh2_store_str(&s, (const char *)key_state->curve25519_public_key,
                           LIBSSH2_ED25519_KEY_LEN);
        key_state->request_len = LIBSSH2_ED25519_KEY_LEN + 5;

        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating curve25519 SHA2"));

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send ECDH_INIT");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        rc = _libssh2_packet_require(session, SSH2_MSG_KEX_ECDH_REPLY,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for ECDH_REPLY reply");
            goto clean_exit;
        }

        key_state->state = libssh2_NB_state_sent2;
    }

    if(key_state->state == libssh2_NB_state_sent2) {

        ret = curve25519_sha256(session, key_state->data, key_state->data_len,
                                key_state->curve25519_public_key,
                                key_state->curve25519_private_key,
                                &key_state->exchange_state);

        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }
    }

clean_exit:

    kex_method_curve25519_cleanup(session, key_state);

    return ret;
}